

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O0

sunindextype SUNDlsMat_denseGETRF(realtype **a,sunindextype m,sunindextype n,sunindextype *p)

{
  realtype rVar1;
  double dVar2;
  realtype *prVar3;
  realtype *prVar4;
  realtype a_kj;
  realtype mult;
  realtype temp;
  realtype *col_k;
  realtype *col_j;
  sunindextype l;
  sunindextype k;
  sunindextype j;
  sunindextype i;
  sunindextype *p_local;
  sunindextype n_local;
  sunindextype m_local;
  realtype **a_local;
  
  k = 0;
  while( true ) {
    if (n <= k) {
      return 0;
    }
    prVar3 = a[k];
    l = k;
    i = k;
    while (i = i + 1, i < m) {
      if (ABS(prVar3[l]) < ABS(prVar3[i])) {
        l = i;
      }
    }
    p[k] = l;
    if ((prVar3[l] == 0.0) && (!NAN(prVar3[l]))) break;
    if (l != k) {
      for (i = 0; i < n; i = i + 1) {
        rVar1 = a[i][l];
        a[i][l] = a[i][k];
        a[i][k] = rVar1;
      }
    }
    dVar2 = prVar3[k];
    i = k;
    while (i = i + 1, j = k, i < m) {
      prVar3[i] = (1.0 / dVar2) * prVar3[i];
    }
    while (j = j + 1, j < n) {
      prVar4 = a[j];
      dVar2 = prVar4[k];
      i = k;
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        while (i = i + 1, i < m) {
          prVar4[i] = -dVar2 * prVar3[i] + prVar4[i];
        }
      }
    }
    k = k + 1;
  }
  return k + 1;
}

Assistant:

sunindextype SUNDlsMat_denseGETRF(realtype **a, sunindextype m, sunindextype n, sunindextype *p)
{
  sunindextype i, j, k, l;
  realtype *col_j, *col_k;
  realtype temp, mult, a_kj;

  /* k-th elimination step number */
  for (k=0; k < n; k++) {

    col_k  = a[k];

    /* find l = pivot row number */
    l=k;
    for (i=k+1; i < m; i++)
      if (SUNRabs(col_k[i]) > SUNRabs(col_k[l])) l=i;
    p[k] = l;

    /* check for zero pivot element */
    if (col_k[l] == ZERO) return(k+1);

    /* swap a(k,1:n) and a(l,1:n) if necessary */
    if ( l!= k ) {
      for (i=0; i<n; i++) {
        temp = a[i][l];
        a[i][l] = a[i][k];
        a[i][k] = temp;
      }
    }

    /* Scale the elements below the diagonal in
     * column k by 1.0/a(k,k). After the above swap
     * a(k,k) holds the pivot element. This scaling
     * stores the pivot row multipliers a(i,k)/a(k,k)
     * in a(i,k), i=k+1, ..., m-1.
     */
    mult = ONE/col_k[k];
    for(i=k+1; i < m; i++) col_k[i] *= mult;

    /* row_i = row_i - [a(i,k)/a(k,k)] row_k, i=k+1, ..., m-1 */
    /* row k is the pivot row after swapping with row l.      */
    /* The computation is done one column at a time,          */
    /* column j=k+1, ..., n-1.                                */

    for (j=k+1; j < n; j++) {

      col_j = a[j];
      a_kj = col_j[k];

      /* a(i,j) = a(i,j) - [a(i,k)/a(k,k)]*a(k,j)  */
      /* a_kj = a(k,j), col_k[i] = - a(i,k)/a(k,k) */

      if (a_kj != ZERO) {
        for (i=k+1; i < m; i++)
          col_j[i] -= a_kj * col_k[i];
      }
    }
  }

  /* return 0 to indicate success */

  return(0);
}